

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

string * __thiscall cmake::StripExtension(string *__return_storage_ptr__,cmake *this,string *file)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [8];
  basic_string_view<char,_std::char_traits<char>_> ext;
  size_type dotpos;
  string *file_local;
  cmake *this_local;
  
  ext._M_str = (char *)std::__cxx11::string::rfind((char)file,0x2e);
  if (ext._M_str != (char *)0xffffffffffffffff) {
    local_48 = (basic_string_view<char,_std::char_traits<char>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)file);
    _local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_48,(size_type)(ext._M_str + 1),0xffffffffffffffff);
    bVar1 = IsAKnownExtension(this,_local_38);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::StripExtension(const std::string& file) const
{
  auto dotpos = file.rfind('.');
  if (dotpos != std::string::npos) {
#if defined(_WIN32) || defined(__APPLE__)
    auto ext = cmSystemTools::LowerCase(file.substr(dotpos + 1));
#else
    auto ext = cm::string_view(file).substr(dotpos + 1);
#endif
    if (this->IsAKnownExtension(ext)) {
      return file.substr(0, dotpos);
    }
  }
  return file;
}